

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dp.c
# Opt level: O0

void MpiProvideWriterDataToReader
               (CP_Services Svcs,DP_RS_Stream RS_Stream_v,int writerCohortSize,
               CP_PeerCohort PeerCohort,void **providedWriterInfo_v)

{
  void *pvVar1;
  undefined8 in_RCX;
  int in_EDX;
  long in_RSI;
  long in_R8;
  int i;
  MpiWriterContactInfo *providedWriterInfo;
  MpiStreamRD StreamRS;
  int local_3c;
  
  *(undefined8 *)(in_RSI + 0x20) = in_RCX;
  *(int *)(in_RSI + 0x18) = in_EDX;
  pvVar1 = malloc((long)in_EDX * 0x50);
  *(void **)(in_RSI + 0x80) = pvVar1;
  pvVar1 = malloc((long)in_EDX << 3);
  *(void **)(in_RSI + 0x88) = pvVar1;
  for (local_3c = 0; local_3c < in_EDX; local_3c = local_3c + 1) {
    memcpy((void *)(*(long *)(in_RSI + 0x80) + (long)local_3c * 0x50),
           *(void **)(in_R8 + (long)local_3c * 8),0x50);
    *(undefined **)(*(long *)(in_RSI + 0x88) + (long)local_3c * 8) = &ompi_mpi_comm_null;
  }
  return;
}

Assistant:

static void MpiProvideWriterDataToReader(CP_Services Svcs, DP_RS_Stream RS_Stream_v,
                                         int writerCohortSize, CP_PeerCohort PeerCohort,
                                         void **providedWriterInfo_v)
{
    MpiStreamRD StreamRS = (MpiStreamRD)RS_Stream_v;
    MpiWriterContactInfo *providedWriterInfo = (MpiWriterContactInfo *)providedWriterInfo_v;

    StreamRS->Link.PeerCohort = PeerCohort;
    StreamRS->Link.CohortSize = writerCohortSize;

    /* * Copy of writer contact information (original will not be preserved) */
    StreamRS->CohortWriterInfo = malloc(sizeof(struct _MpiWriterContactInfo) * writerCohortSize);
    StreamRS->CohortMpiComms = malloc(sizeof(MPI_Comm) * writerCohortSize);
    for (int i = 0; i < writerCohortSize; i++)
    {
        memcpy(&StreamRS->CohortWriterInfo[i], providedWriterInfo[i],
               sizeof(struct _MpiWriterContactInfo));
        StreamRS->CohortMpiComms[i] = MPI_COMM_NULL;
    }
}